

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

string * __thiscall SimpleLogger::getLogFilePath_abi_cxx11_(SimpleLogger *this,size_t file_num)

{
  long in_RDX;
  string *in_RSI;
  string *in_RDI;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  if (in_RDX == 0) {
    std::__cxx11::string::string(in_RDI,in_RSI);
  }
  else {
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffffb8);
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

std::string SimpleLogger::getLogFilePath(size_t file_num) const {
    if (file_num) {
        return filePath + "." + std::to_string(file_num);
    }
    return filePath;
}